

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O0

void __thiscall
NULLC::TraceArray<NULLC::TraceScopeToken>::TraceArray
          (TraceArray<NULLC::TraceScopeToken> *this,uint size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  TraceScopeToken *pTVar4;
  TraceScopeToken *local_50;
  uint size_local;
  TraceArray<NULLC::TraceScopeToken> *this_local;
  
  this->count = 0;
  this->max = size;
  if (size == 0) {
    this->data = (TraceScopeToken *)0x0;
  }
  else {
    uVar2 = CONCAT44(0,size);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pTVar4 = (TraceScopeToken *)operator_new__(uVar3);
    if (uVar2 != 0) {
      local_50 = pTVar4;
      do {
        TraceScopeToken::TraceScopeToken(local_50);
        local_50 = local_50 + 1;
      } while (local_50 != pTVar4 + uVar2);
    }
    this->data = pTVar4;
  }
  return;
}

Assistant:

TraceArray(unsigned size)
		{
			count = 0;
			max = size;

			if(size)
				data = new T[size];
			else
				data = NULL;
		}